

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

Entry * __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::FindSlotForId<false>
          (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *this,
          unsigned_long id)

{
  Entry *pEVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = CONCAT44(0,this->m_h1Prime);
  if (((uVar6 != 0) && ((ulong)this->m_h2Prime != 0)) &&
     (pEVar1 = this->m_hashArray, pEVar1 != (Entry *)0x0)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = id;
    uVar6 = SUB168(auVar3 % auVar2,0);
    if (pEVar1[uVar6].Key != id) {
      uVar4 = this->m_capacity - 1;
      uVar5 = (int)(id % (ulong)this->m_h2Prime) + SUB164(auVar3 % auVar2,0) & uVar4;
      uVar7 = uVar5;
      while (uVar6 = (ulong)uVar7, pEVar1[uVar6].Key != id) {
        uVar7 = uVar7 + 1 & uVar4;
        if (uVar7 == uVar5) {
          TTDAbort_unrecoverable_error("The key is not here (or we messed up).");
        }
      }
    }
    return pEVar1 + uVar6;
  }
  TTDAbort_unrecoverable_error("Not valid!!");
}

Assistant:

Entry* FindSlotForId(Tag id) const
        {
            TTDAssert(this->m_h1Prime != 0 && this->m_h2Prime != 0, "Not valid!!");
            TTDAssert(this->m_hashArray != nullptr, "Not valid!!");

            Tag searchKey = findEmpty ? 0 : id;

            //h1Prime is less than table size by construction so we dont need to re-index
            uint32 primaryIndex = TTD_DICTIONARY_HASH(id, this->m_h1Prime);
            if (this->m_hashArray[primaryIndex].Key == searchKey)
            {
                return (this->m_hashArray + primaryIndex);
            }

            //do a hash for the second offset to avoid clustering and then do linear probing
            uint32 offset = TTD_DICTIONARY_HASH(id, this->m_h2Prime);
            uint32 probeIndex = TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity);
            while (true)
            {
                Entry* curr = (this->m_hashArray + probeIndex);
                if (curr->Key == searchKey)
                {
                    return curr;
                }
                probeIndex = TTD_DICTIONARY_INDEX(probeIndex + 1, this->m_capacity);

                TTDAssert(probeIndex != TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity), "The key is not here (or we messed up).");
            }
        }